

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debuginfo.cpp
# Opt level: O1

void sAppendPrintF(string *str,char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arg;
  char buffer [512];
  undefined8 local_2e8;
  void **local_2e0;
  undefined1 *local_2d8;
  undefined1 local_2c8 [16];
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 local_258;
  undefined8 local_248;
  undefined8 local_238;
  undefined8 local_228;
  char local_218 [507];
  undefined4 local_1d;
  undefined1 local_19;
  
  local_2d8 = local_2c8;
  if (in_AL != '\0') {
    local_298 = in_XMM0_Qa;
    local_288 = in_XMM1_Qa;
    local_278 = in_XMM2_Qa;
    local_268 = in_XMM3_Qa;
    local_258 = in_XMM4_Qa;
    local_248 = in_XMM5_Qa;
    local_238 = in_XMM6_Qa;
    local_228 = in_XMM7_Qa;
  }
  local_2e0 = &arg[0].overflow_arg_area;
  local_2e8 = 0x3000000010;
  local_2b8 = in_RDX;
  local_2b0 = in_RCX;
  local_2a8 = in_R8;
  local_2a0 = in_R9;
  vsnprintf(local_218,0x1ff,format,&local_2e8);
  local_19 = 0;
  local_1d = 0xa2e2e2e;
  std::__cxx11::string::append((char *)str);
  return;
}

Assistant:

static void sAppendPrintF(std::string &str, const char *format, ...)
{
    static const int bufferSize = 512; // cut off after this
    char buffer[bufferSize];
    va_list arg;

    va_start(arg, format);
    vsnprintf(buffer, bufferSize - 1, format, arg);
    va_end(arg);

    strcpy(&buffer[bufferSize - 5], "...\n");
    str += buffer;
}